

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

prsndef * prsnew0(prscxdef *ctx,tokdef *tokp)

{
  prsndef *ppVar1;
  long lVar2;
  prsndef *ppVar3;
  
  if (0x77 < ctx->prscxnrem) {
    ppVar3 = (prsndef *)ctx->prscxnode;
    ppVar1 = ppVar3;
    ctx->prscxnrem = ctx->prscxnrem - 0x78;
    ctx->prscxnode = (uchar *)(ppVar3 + 1);
    ppVar3->prsntyp = 0;
    ppVar3->prsnnlf = 0;
    for (lVar2 = 0xe; ppVar3 = (prsndef *)&ppVar3->prsnv, lVar2 != 0; lVar2 = lVar2 + -1) {
      *(prsndef **)ppVar3 = *(prsndef **)tokp;
      tokp = (tokdef *)&tokp->tokval;
    }
    return ppVar1;
  }
  errsigf(ctx->prscxerr,"TADS",0x131);
}

Assistant:

uchar *prsbalo(prscxdef *ctx, uint siz)
{
    uchar *ret;

    /* round size for alignment, and see if we have room for it */
    siz = osrndsz(siz);
    if (ctx->prscxnrem < siz) errsig(ctx->prscxerr, ERR_NONODE);

    /* adjust sizes and pointers, and return the new node */
    ret = ctx->prscxnode;
    ctx->prscxnrem -= siz;
    ctx->prscxnode += siz;
    return(ret);
}